

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O2

QDeviceDiscovery * QDeviceDiscovery::create(QDeviceTypes types,QObject *parent)

{
  QDebug *pQVar1;
  udev *udev;
  QDeviceDiscovery *this;
  long in_FS_OFFSET;
  char local_68 [24];
  char *local_50;
  QDebug local_48;
  QDebug local_40;
  undefined1 local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lcDD();
  if (((byte)lcDD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_68[0] = '\x02';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    local_50 = lcDD::category.name;
    QMessageLogger::debug();
    pQVar1 = QDebug::operator<<(&local_48,"udev device discovery for type");
    local_40.stream = pQVar1->stream;
    *(int *)(local_40.stream + 0x28) = *(int *)(local_40.stream + 0x28) + 1;
    operator<<<QFlags<QDeviceDiscovery::QDeviceType>,_true>
              ((Stream *)local_38,
               (QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4>)SUB84(&local_40,0));
    QDebug::~QDebug((QDebug *)local_38);
    QDebug::~QDebug(&local_40);
    QDebug::~QDebug(&local_48);
  }
  udev = (udev *)udev_new();
  if (udev == (udev *)0x0) {
    local_68[0] = '\x02';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_50 = "default";
    this = (QDeviceDiscovery *)0x0;
    QMessageLogger::warning(local_68,"Failed to get udev library context");
  }
  else {
    this = (QDeviceDiscovery *)operator_new(0x38);
    QDeviceDiscoveryUDev::QDeviceDiscoveryUDev((QDeviceDiscoveryUDev *)this,types,udev,parent);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDeviceDiscovery *QDeviceDiscovery::create(QDeviceTypes types, QObject *parent)
{
    qCDebug(lcDD) << "udev device discovery for type" << types;

    QDeviceDiscovery *helper = nullptr;
    struct udev *udev;

    udev = udev_new();
    if (udev) {
        helper = new QDeviceDiscoveryUDev(types, udev, parent);
    } else {
        qWarning("Failed to get udev library context");
    }

    return helper;
}